

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O0

int __thiscall Qclass::rewardfunc(Qclass *this,int lastAction,int x,int y)

{
  int local_20;
  int reward;
  int y_local;
  int x_local;
  int lastAction_local;
  Qclass *this_local;
  
  if (lastAction == 0) {
    if ((x + 1 == this->goal_x) && (y == this->goal_y)) {
      local_20 = 1000;
    }
    else {
      if (x + 1 < 0x32) {
        local_20 = this->grid[x + 1][y] * -10000 + -0x32;
      }
      else {
        local_20 = -10000;
        this->restart = true;
      }
      if (this->grid[x + 1][y] == 1) {
        this->restart = true;
      }
    }
  }
  if (lastAction == 1) {
    if ((x + -1 == this->goal_x) && (y == this->goal_y)) {
      local_20 = 1000;
    }
    else {
      if (x + -1 < 0) {
        local_20 = -10000;
        this->restart = true;
      }
      else {
        local_20 = this->grid[x + -1][y] * -10000 + -0x32;
      }
      if (this->grid[x + -1][y] == 1) {
        this->restart = true;
      }
    }
  }
  if (lastAction == 2) {
    if ((x == this->goal_x) && (y + 1 == this->goal_y)) {
      local_20 = 1000;
    }
    else {
      if (y + 1 < 0x32) {
        local_20 = this->grid[x][y + 1] * -10000 + -0x32;
      }
      else {
        local_20 = -10000;
        this->restart = true;
      }
      if (this->grid[x][y + 1] == 1) {
        this->restart = true;
      }
    }
  }
  if (lastAction == 3) {
    if ((x == this->goal_x) && (y + -1 == this->goal_y)) {
      local_20 = 1000;
    }
    else {
      if (y + -1 < 0) {
        local_20 = -10000;
        this->restart = true;
      }
      else {
        local_20 = this->grid[x][y + -1] * -10000 + -0x32;
      }
      if (this->grid[x][y + -1] == 1) {
        this->restart = true;
      }
    }
  }
  return local_20;
}

Assistant:

int Qclass::rewardfunc(int lastAction, int x, int y) {
  int reward;
  if (lastAction == 0) {
    // High positive reward for reaching the goal state
    if (x + 1 == goal_x && y == goal_y) {
      reward = 1000;
    } else {
      // High negative reward for exceeding map boundaries
      // High negative reward when obstacle is present
      if (x + 1 <= 49) {
        reward = grid[x + 1][y] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x + 1][y] == 1) {
        restart = true;
      }
    }
  }
  if (lastAction == 1) {
    if (x - 1 == goal_x && y == goal_y) {
      reward = 1000;
    } else {
      if (x - 1 >= 0) {
        reward = grid[x - 1][y] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x - 1][y] == 1) {
        restart = true;
      }
    }
  }
  if (lastAction == 2) {
    if (x == goal_x && y + 1 == goal_y) {
      reward = 1000;
    } else {
      if (y + 1 <= 49) {
        reward = grid[x][y + 1] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x][y + 1] == 1) {
        restart = true;
      }
    }
  }
  if (lastAction == 3) {
    if (x == goal_x && y - 1 == goal_y) {
      reward = 1000;
    } else {
      if (y - 1 >= 0) {
        reward = grid[x][y - 1] * -10000 - 50;
      } else {
        reward = -10000;
        restart = true;
      }
      if (grid[x][y - 1] == 1) {
        restart = true;
      }
    }
  }
  return reward;
}